

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Bech32.cpp
# Opt level: O3

void __thiscall
Bech32Test_create_checksum_Test::~Bech32Test_create_checksum_Test
          (Bech32Test_create_checksum_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Bech32Test, create_checksum) {
    std::string hrp = "a";
    std::vector<unsigned char> data;
    std::vector<unsigned char> checksum = createChecksum(hrp, data);

    ASSERT_EQ(checksum[0], '\x1F');
    ASSERT_EQ(checksum[1], '\x00');
    ASSERT_EQ(checksum[2], '\x09');
    ASSERT_EQ(checksum[3], '\x13');
    ASSERT_EQ(checksum[4], '\x11');
    ASSERT_EQ(checksum[5], '\x1D');

    std::string mapped = mapToCharset(checksum);

    ASSERT_EQ(mapped, "lqfn3a");

    ////

    hrp = "abcdef";
    data = {'l','7','a','u','m','6','e','c','h','k','4','5','n','j','3','s','0','w','d',
            'v','t','2','f','g','8','x','9','y','r','z','p','q'};

    mapDP(data);
    checksum = createChecksum(hrp, data);

    ASSERT_EQ(checksum[0], '\x02');
    ASSERT_EQ(checksum[1], '\x0D');
    ASSERT_EQ(checksum[2], '\x11');
    ASSERT_EQ(checksum[3], '\x03');
    ASSERT_EQ(checksum[4], '\x04');
    ASSERT_EQ(checksum[5], '\x06');

    mapped = mapToCharset(checksum);

    ASSERT_EQ(mapped, "zd3ryx");

    ////

    hrp = "split";
    data = {'c','h','e','c','k','u','p','s','t','a','g','e','h','a','n','d','s','h','a',
            'k','e','u','p','s','t','r','e','a','m','e','r','r','a','n','t','e','r','r',
            'e','d','c','a','p','e','r','r','e','d'};

    mapDP(data);
    checksum = createChecksum(hrp, data);

    ASSERT_EQ(checksum[0], '\x1F');
    ASSERT_EQ(checksum[1], '\x18');
    ASSERT_EQ(checksum[2], '\x15');
    ASSERT_EQ(checksum[3], '\x15');
    ASSERT_EQ(checksum[4], '\x14');
    ASSERT_EQ(checksum[5], '\x0C');

    mapped = mapToCharset(checksum);

    ASSERT_EQ(mapped, "lc445v");

    ////

    hrp = "an83characterlonghumanreadablepartthatcontainsthetheexcludedcharactersbioandnumber1";
    data = {};

    mapDP(data);
    checksum = createChecksum(hrp, data);

    ASSERT_EQ(checksum[0], '\x10');
    ASSERT_EQ(checksum[1], '\x08');
    ASSERT_EQ(checksum[2], '\x1E');
    ASSERT_EQ(checksum[3], '\x17');
    ASSERT_EQ(checksum[4], '\x08');
    ASSERT_EQ(checksum[5], '\x1A');

    mapped = mapToCharset(checksum);

    ASSERT_EQ(mapped, "sg7hg6");

    ////

    hrp = "1";
    data = {'l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l',
            'l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l',
            'l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l',
            'l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l','l',
            'l','l','l','l','l','l'};

    mapDP(data);
    checksum = createChecksum(hrp, data);

    ASSERT_EQ(checksum[0], '\x1F');
    ASSERT_EQ(checksum[1], '\x1C');
    ASSERT_EQ(checksum[2], '\x0D');
    ASSERT_EQ(checksum[3], '\x10');
    ASSERT_EQ(checksum[4], '\x03');
    ASSERT_EQ(checksum[5], '\x07');

    mapped = mapToCharset(checksum);

    ASSERT_EQ(mapped, "ludsr8");

}